

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateFastInlineMathImul(Lowerer *this,Instr *instr)

{
  Opnd *dstOpnd;
  Opnd *src1Opnd;
  Opnd *src2Opnd;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *instr_00;
  
  dstOpnd = instr->m_dst;
  src1Opnd = instr->m_src1;
  src2Opnd = instr->m_src2;
  if (dstOpnd->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x528d,"(dst->IsInt32())","dst->IsInt32()");
    if (!bVar2) goto LAB_0059f431;
    *puVar3 = 0;
  }
  if (src1Opnd->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x528e,"(src1->IsInt32())","src1->IsInt32()");
    if (!bVar2) goto LAB_0059f431;
    *puVar3 = 0;
  }
  if (src2Opnd->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x528f,"(src2->IsInt32())","src2->IsInt32()");
    if (!bVar2) {
LAB_0059f431:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  instr_00 = IR::Instr::New(IMUL2,dstOpnd,src1Opnd,src2Opnd,instr->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::Legalize<false>(instr_00,false);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineMathImul(IR::Instr* instr)
{
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    IR::Opnd* dst = instr->GetDst();

    Assert(dst->IsInt32());
    Assert(src1->IsInt32());
    Assert(src2->IsInt32());

    IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, dst, src1, src2, instr->m_func);
    instr->InsertBefore(imul);

    LowererMD::Legalize(imul);

    instr->Remove();
}